

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_shared_mutex.hpp
# Opt level: O3

bool __thiscall
yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::
do_try_lockwait<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *this,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *tp,char *emsg)

{
  cv_status cVar1;
  id tid;
  __normal_iterator<std::thread::id_*,_std::vector<std::thread::id,_std::allocator<std::thread::id>_>_>
  _Var2;
  system_error *this_00;
  error_category *peVar3;
  bool bVar4;
  error_code __ec;
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> local_48;
  native_handle_type local_38;
  
  tid._M_thread = pthread_self();
  local_48._M_device = (mutex_type *)(this + 0x58);
  local_48._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_48);
  local_48._M_owns = true;
  if (*(native_handle_type *)(this + 8) != tid._M_thread) {
    local_38 = tid._M_thread;
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::thread::id*,std::vector<std::thread::id,std::allocator<std::thread::id>>>,__gnu_cxx::__ops::_Iter_equals_val<std::thread::id_const>>
                      (*(undefined8 *)(this + 0x10),*(undefined8 *)(this + 0x18));
    if (_Var2._M_current == *(id **)(this + 0x18)) {
      do {
        if (*(long *)this == 0) goto LAB_001ea63b;
        cVar1 = std::condition_variable::
                __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                          ((condition_variable *)(this + 0x28),&local_48,tp);
      } while (cVar1 != timeout);
      if (*(long *)this == 0) {
LAB_001ea63b:
        *(undefined8 *)this = 0x8000000000000000;
        *(native_handle_type *)(this + 8) = tid._M_thread;
        bVar4 = true;
        validator::deadlock::locked((uintptr_t)this,tid,false);
      }
      else {
        bVar4 = false;
      }
      std::unique_lock<std::mutex>::~unique_lock(&local_48);
      return bVar4;
    }
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  peVar3 = (error_category *)std::_V2::generic_category();
  __ec._M_cat = peVar3;
  __ec._0_8_ = 0x23;
  std::system_error::system_error(this_00,__ec,emsg);
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

bool do_try_lockwait(const std::chrono::time_point<Clock, Duration>& tp, const char* emsg)
  {
    const auto tid = std::this_thread::get_id();
    std::unique_lock<decltype(mtx_)> lk(mtx_);
    if (e_owner_ == tid || base::is_shared_owner(tid)) {
      // non-recursive semantics
#if YAMC_CHECKED_CALL_ABORT
      std::abort();
      (void)emsg; // suppress "unused variable" warning
#else
      throw std::system_error(std::make_error_code(std::errc::resource_deadlock_would_occur), emsg);
#endif
    }
    RwLockPolicy::before_wait_wlock(state_);
    while (RwLockPolicy::wait_wlock(state_)) {
      if (cv_.wait_until(lk, tp) == std::cv_status::timeout) {
        if (!RwLockPolicy::wait_wlock(state_))  // re-check predicate
          break;
        RwLockPolicy::after_wait_wlock(state_);
        return false;
      }
    }
    RwLockPolicy::after_wait_wlock(state_);
    RwLockPolicy::acquire_wlock(state_);
    e_owner_ = tid;
    detail::validator::locked(reinterpret_cast<uintptr_t>(this), tid, false);
    return true;
  }